

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetSegmentByIndex
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l,int64_t index)

{
  bool bVar1;
  reference pvVar2;
  
  if (index < 0) {
    do {
      bVar1 = LoadNextSegment(this,l);
    } while (bVar1);
    index = ((long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes).
                   super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   .
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) + index;
    if (index < 0) {
      return (RowGroup *)0x0;
    }
  }
  else {
    do {
      if ((ulong)index <
          (ulong)((long)(this->nodes).
                        super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                        .
                        super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                        .
                        super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) break;
      bVar1 = LoadNextSegment(this,l);
    } while (bVar1);
    if ((ulong)((long)(this->nodes).
                      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->nodes).
                      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)index) {
      return (RowGroup *)0x0;
    }
  }
  pvVar2 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[](&this->nodes,index);
  return (pvVar2->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
}

Assistant:

T *GetSegmentByIndex(SegmentLock &l, int64_t index) {
		if (index < 0) {
			// load all segments
			LoadAllSegments(l);
			index += nodes.size();
			if (index < 0) {
				return nullptr;
			}
			return nodes[UnsafeNumericCast<idx_t>(index)].node.get();
		} else {
			// lazily load segments until we reach the specific segment
			while (idx_t(index) >= nodes.size() && LoadNextSegment(l)) {
			}
			if (idx_t(index) >= nodes.size()) {
				return nullptr;
			}
			return nodes[UnsafeNumericCast<idx_t>(index)].node.get();
		}
	}